

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableElimination.cpp
# Opt level: O2

ClauseIterator __thiscall
Inferences::ALASCA::VariableElimination::applyRule<Kernel::NumTraits<Kernel::RationalConstantType>>
          (VariableElimination *this,Clause *premise,
          FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>_> *found)

{
  uint uVar1;
  Value VVar2;
  MaybeUninit<unsigned_int> MVar3;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar4;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *pFVar5;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *pFVar6;
  uint uVar7;
  TermList TVar8;
  Term *pTVar9;
  Literal *pLVar10;
  TermList rhs;
  uint *in_RCX;
  long lVar11;
  long lVar12;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *orig;
  PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *i_00;
  ulong uVar13;
  uint uVar14;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *j;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *pFVar15;
  long lVar16;
  uint i;
  ulong uVar17;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *pFVar18;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *i_1;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *pFVar19;
  uint *puVar20;
  code *pcVar21;
  byte bVar22;
  anon_class_1_0_00000001_for_sum sum;
  anon_class_16_1_54a39818_for_b b;
  StlIter __begin4;
  Stack<Kernel::Literal_*> common;
  IterTraits<Lib::RangeIterator<unsigned_int>_> local_4f8;
  StlIter __begin3;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:250:15),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:251:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:252:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>_>
  local_490;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:250:15),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:251:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:252:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>_>
  local_450;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:250:15),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:251:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:252:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>_>
  local_410;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:250:15),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:251:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:252:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>_>
  local_3d0;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:250:15),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:251:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:252:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>_>
  local_390;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:250:15),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:251:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:252:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>_>
  local_350;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:250:15),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:251:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:252:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:261:42),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>_>
  local_310;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:250:15),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:251:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:252:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:261:42),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>_>
  local_2c8;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  local_280;
  RangeIterator<unsigned_int> local_260;
  PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  local_250;
  anon_class_184_10_db932ed9_for__func local_1f8;
  MappingIterator<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:313:12),_Kernel::Clause_*>
  local_140;
  
  lVar11 = DAT_00a141a0;
  uVar13 = *(long *)(in_RCX + 0x18) - *(long *)(in_RCX + 0x16) >> 6;
  uVar1 = *in_RCX;
  pMVar4 = *(MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(in_RCX + 2);
  if (*(long *)(in_RCX + 0x18) != *(long *)(in_RCX + 0x16)) {
    *(int *)(DAT_00a141a0 + 0x194) = *(int *)(DAT_00a141a0 + 0x194) + 1;
  }
  *(int *)(lVar11 + 0x198) = *(int *)(lVar11 + 0x198) + (int)uVar13;
  if (*(uint *)(lVar11 + 0x19c) < uVar13) {
    *(int *)(lVar11 + 0x19c) = (int)uVar13;
  }
  lVar11 = *(long *)(in_RCX + 8) - *(long *)(in_RCX + 6) >> 6;
  lVar16 = *(long *)(in_RCX + 0x10) - *(long *)(in_RCX + 0xe) >> 6;
  lVar12 = *(long *)(in_RCX + 0x20) - *(long *)(in_RCX + 0x1e) >> 6;
  Lib::Stack<Kernel::Literal_*>::Stack
            (&common,((lVar16 * lVar11 + (ulong)((uint)(found->negIneq)._stack & 0xfffff)) -
                     (lVar12 + lVar16 + lVar11 + uVar13)) + (lVar16 + lVar11) * lVar12);
  b.x._0_8_ = &__begin3;
  __begin3._iter.super_OptionBase<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_&>.
  super_OptionBaseRef<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_*>._elem =
       (OptionBase<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_&>)
       (OptionBaseRef<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_*>)0x0;
  __begin3._cur.super_OptionBase<unsigned_int>._isSome = false;
  __begin3._cur.super_OptionBase<unsigned_int>._1_3_ = 0;
  __begin3._cur.super_OptionBase<unsigned_int>._elem._elem = (Value)0x0;
  const::{lambda(auto:1&)#1}::operator()
            ((_lambda_auto_1___1_ *)&b,
             (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)(in_RCX + 0x14));
  const::{lambda(auto:1&)#1}::operator()
            ((_lambda_auto_1___1_ *)&b,
             (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)(in_RCX + 0x1c));
  const::{lambda(auto:1&)#1}::operator()
            ((_lambda_auto_1___1_ *)&b,
             (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)(in_RCX + 4));
  const::{lambda(auto:1&)#1}::operator()
            ((_lambda_auto_1___1_ *)&b,
             (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)(in_RCX + 0xc));
  std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
            (__begin3._cur.super_OptionBase<unsigned_int>,0);
  if (__begin3._cur.super_OptionBase<unsigned_int> == (OptionBase<unsigned_int>)0x0) {
    uVar14 = *(uint *)&(found->negIneq)._stack & 0xfffff;
    puVar20 = (uint *)0x0;
  }
  else {
    uVar14 = *(uint *)__begin3._cur.super_OptionBase<unsigned_int>;
    puVar20 = (uint *)((long)__begin3._cur.super_OptionBase<unsigned_int> + 4);
  }
  for (uVar17 = 0; uVar7 = (uint)(found->negIneq)._stack & 0xfffff, uVar17 < uVar7;
      uVar17 = uVar17 + 1) {
    if (uVar17 == uVar14) {
      uVar14 = uVar7;
      if (puVar20 != (uint *)0x0) {
        uVar14 = *puVar20;
        puVar20 = puVar20 + 1;
      }
    }
    else {
      Lib::Stack<Kernel::Literal_*>::push(&common,(Literal *)(&(found->neq)._capacity)[uVar17]);
    }
  }
  Lib::Stack<unsigned_int>::~Stack((Stack<unsigned_int> *)&__begin3);
  b.x._id = uVar1;
  pFVar5 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(in_RCX + 8);
  b.x._ptr = pMVar4;
  for (pFVar19 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
                  (in_RCX + 6); pFVar19 != pFVar5; pFVar19 = pFVar19 + 1) {
    pFVar6 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
              (in_RCX + 0x10);
    pFVar15 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
               (in_RCX + 0xe);
    pFVar18 = pFVar15;
    for (; pFVar15 != pFVar6; pFVar15 = pFVar15 + 1) {
      if (((pFVar19->literal)._symbol != GREATER) ||
         (pcVar21 = Kernel::NumTraits<Kernel::RationalConstantType>::greater,
         (pFVar15->literal)._symbol != GREATER)) {
        pcVar21 = Kernel::NumTraits<Kernel::RationalConstantType>::geq;
      }
      local_350._iter._inner._inner._inn._iter._func.a =
           (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
           (pFVar19->literal)._term._ptr;
      local_350._iter._inner._inner._inn._iter._inner._to =
           ((long)(local_350._iter._inner._inner._inn._iter._func.a)->_cursor -
           (long)(local_350._iter._inner._inner._inn._iter._func.a)->_stack) / 0x30;
      local_350._iter._inner._inner._inn._iter._inner._next = 0;
      local_350._iter._inner._inner._inn._iter._inner._from = 0;
      local_390._iter._inner._inner._func.x = &b.x;
      local_350._iter._inner._inner._next.
      super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>.
      super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>.
      _elem = (OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>)
              (OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>
               )0x0;
      local_390._iter._inner._inner._inn._iter._func.a =
           (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
           (pFVar15->literal)._term._ptr;
      local_390._iter._inner._inner._inn._iter._inner._to =
           ((long)(local_390._iter._inner._inner._inn._iter._func.a)->_cursor -
           (long)(local_390._iter._inner._inner._inn._iter._func.a)->_stack) / 0x30;
      local_390._iter._inner._inner._inn._iter._inner._next = 0;
      local_390._iter._inner._inner._inn._iter._inner._from = 0;
      local_390._iter._inner._inner._next.
      super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>.
      super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>.
      _elem = (OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>)
              (OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>
               )0x0;
      local_390._iter._func.i = pFVar18;
      local_390._iter._inner._func.i = pFVar18;
      local_350._iter._func.i = pFVar19;
      local_350._iter._inner._func.i = pFVar19;
      local_350._iter._inner._inner._func.x = local_390._iter._inner._inner._func.x;
      TVar8 = const::{lambda(auto:1,auto:2)#1}::operator()(&sum,&local_350,&local_390);
      pTVar9 = Kernel::NumTraits<Kernel::RationalConstantType>::zeroT();
      pLVar10 = (Literal *)(*pcVar21)(1,TVar8._content,pTVar9);
      Lib::Stack<Kernel::Literal_*>::push(&common,pLVar10);
      pFVar18 = pFVar18 + 1;
    }
  }
  pFVar5 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(in_RCX + 8);
  for (pFVar19 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
                  (in_RCX + 6); pFVar19 != pFVar5; pFVar19 = pFVar19 + 1) {
    pFVar6 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
              (in_RCX + 0x20);
    pFVar15 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
               (in_RCX + 0x1e);
    for (pFVar18 = pFVar15; pFVar18 != pFVar6; pFVar18 = pFVar18 + 1) {
      pcVar21 = Kernel::NumTraits<Kernel::RationalConstantType>::geq;
      if ((pFVar19->literal)._symbol == GREATER) {
        pcVar21 = Kernel::NumTraits<Kernel::RationalConstantType>::greater;
      }
      local_3d0._iter._inner._inner._inn._iter._func.a =
           (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
           (pFVar19->literal)._term._ptr;
      local_3d0._iter._inner._inner._inn._iter._inner._to =
           ((long)(local_3d0._iter._inner._inner._inn._iter._func.a)->_cursor -
           (long)(local_3d0._iter._inner._inner._inn._iter._func.a)->_stack) / 0x30;
      local_3d0._iter._inner._inner._inn._iter._inner._next = 0;
      local_3d0._iter._inner._inner._inn._iter._inner._from = 0;
      local_3d0._iter._inner._inner._func.x = &b.x;
      local_3d0._iter._inner._inner._next.
      super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>.
      super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>.
      _elem = (OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>)
              (OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>
               )0x0;
      local_2c8._iter._inner._inner._inner._inn._iter._func.a =
           (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
           (pFVar18->literal)._term._ptr;
      local_2c8._iter._inner._inner._inner._inn._iter._inner._to =
           ((long)(local_2c8._iter._inner._inner._inner._inn._iter._func.a)->_cursor -
           (long)(local_2c8._iter._inner._inner._inner._inn._iter._func.a)->_stack) / 0x30;
      local_2c8._iter._inner._inner._inner._inn._iter._inner._next = 0;
      local_2c8._iter._inner._inner._inner._inn._iter._inner._from = 0;
      local_2c8._iter._inner._inner._inner._next.
      super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>.
      super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>.
      _elem = (OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>)
              (OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>
               )0x0;
      local_3d0._iter._func.i = pFVar19;
      local_3d0._iter._inner._func.i = pFVar19;
      local_2c8._iter._inner._func.i = pFVar15;
      local_2c8._iter._inner._inner._func.i = pFVar15;
      local_2c8._iter._inner._inner._inner._func.x = local_3d0._iter._inner._inner._func.x;
      TVar8 = const::{lambda(auto:1,auto:2)#1}::operator()(&sum,&local_3d0,&local_2c8);
      pTVar9 = Kernel::NumTraits<Kernel::RationalConstantType>::zeroT();
      pLVar10 = (Literal *)(*pcVar21)(1,TVar8._content,pTVar9);
      Lib::Stack<Kernel::Literal_*>::push(&common,pLVar10);
      pFVar15 = pFVar15 + 1;
    }
  }
  pFVar5 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(in_RCX + 0x10);
  for (pFVar19 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
                  (in_RCX + 0xe); pFVar19 != pFVar5; pFVar19 = pFVar19 + 1) {
    pFVar6 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
              (in_RCX + 0x20);
    pFVar15 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
               (in_RCX + 0x1e);
    pFVar18 = pFVar15;
    for (; pFVar15 != pFVar6; pFVar15 = pFVar15 + 1) {
      pcVar21 = Kernel::NumTraits<Kernel::RationalConstantType>::geq;
      if ((pFVar19->literal)._symbol == GREATER) {
        pcVar21 = Kernel::NumTraits<Kernel::RationalConstantType>::greater;
      }
      local_410._iter._inner._inner._inn._iter._func.a =
           (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
           (pFVar19->literal)._term._ptr;
      local_410._iter._inner._inner._inn._iter._inner._to =
           ((long)(local_410._iter._inner._inner._inn._iter._func.a)->_cursor -
           (long)(local_410._iter._inner._inner._inn._iter._func.a)->_stack) / 0x30;
      local_410._iter._inner._inner._inn._iter._inner._next = 0;
      local_410._iter._inner._inner._inn._iter._inner._from = 0;
      local_450._iter._inner._inner._func.x = &b.x;
      local_410._iter._inner._inner._next.
      super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>.
      super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>.
      _elem = (OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>)
              (OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>
               )0x0;
      local_450._iter._inner._inner._inn._iter._func.a =
           (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
           (pFVar15->literal)._term._ptr;
      local_450._iter._inner._inner._inn._iter._inner._to =
           ((long)(local_450._iter._inner._inner._inn._iter._func.a)->_cursor -
           (long)(local_450._iter._inner._inner._inn._iter._func.a)->_stack) / 0x30;
      local_450._iter._inner._inner._inn._iter._inner._next = 0;
      local_450._iter._inner._inner._inn._iter._inner._from = 0;
      local_450._iter._inner._inner._next.
      super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>.
      super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>.
      _elem = (OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>)
              (OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>
               )0x0;
      local_450._iter._func.i = pFVar18;
      local_450._iter._inner._func.i = pFVar18;
      local_410._iter._func.i = pFVar19;
      local_410._iter._inner._func.i = pFVar19;
      local_410._iter._inner._inner._func.x = local_450._iter._inner._inner._func.x;
      TVar8 = const::{lambda(auto:1,auto:2)#1}::operator()(&sum,&local_410,&local_450);
      pTVar9 = Kernel::NumTraits<Kernel::RationalConstantType>::zeroT();
      pLVar10 = (Literal *)(*pcVar21)(1,TVar8._content,pTVar9);
      Lib::Stack<Kernel::Literal_*>::push(&common,pLVar10);
      pFVar18 = pFVar18 + 1;
    }
  }
  local_260._next = 0;
  local_260._from = 0;
  local_260._to = (uint)((ulong)(*(long *)(in_RCX + 0x20) - *(long *)(in_RCX + 0x1e)) >> 6);
  Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::StlIter::StlIter
            (&__begin3,(IterTraits<Lib::RangeIterator<unsigned_int>_> *)&local_260);
  bVar22 = __begin3._cur.super_OptionBase<unsigned_int>._isSome;
  while ((bVar22 & 1) != 0) {
    uVar17 = (ulong)(uint)__begin3._cur.super_OptionBase<unsigned_int>._elem._elem;
    local_4f8._iter._0_8_ =
         (ulong)((int)__begin3._cur.super_OptionBase<unsigned_int>._elem._elem + 1) * 0x100000001;
    local_4f8._iter._to = (uint)((ulong)(*(long *)(in_RCX + 0x20) - *(long *)(in_RCX + 0x1e)) >> 6);
    Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::StlIter::StlIter(&__begin4,&local_4f8);
    while ((__begin4._cur.super_OptionBase<unsigned_int>._isSome & 1U) != 0) {
      lVar11 = *(long *)(in_RCX + 0x1e);
      local_490._iter._func.i =
           (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
           (lVar11 + uVar17 * 0x40);
      local_310._iter._inner._func.i =
           (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
           (lVar11 + (ulong)(uint)__begin4._cur.super_OptionBase<unsigned_int>._elem._elem * 0x40);
      local_490._iter._inner._inner._inn._iter._func.a =
           *(Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> **)
            (lVar11 + 0x30 + uVar17 * 0x40);
      local_490._iter._inner._inner._inn._iter._inner._to =
           ((long)(local_490._iter._inner._inner._inn._iter._func.a)->_cursor -
           (long)(local_490._iter._inner._inner._inn._iter._func.a)->_stack) / 0x30;
      local_490._iter._inner._inner._inn._iter._inner._next = 0;
      local_490._iter._inner._inner._inn._iter._inner._from = 0;
      local_490._iter._inner._inner._func.x = &b.x;
      local_490._iter._inner._inner._next.
      super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>.
      super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>.
      _elem = (OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>)
              (OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>
               )0x0;
      local_310._iter._inner._inner._inner._inn._iter._func.a =
           *(Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> **)
            (lVar11 + 0x30 +
            (ulong)(uint)__begin4._cur.super_OptionBase<unsigned_int>._elem._elem * 0x40);
      local_310._iter._inner._inner._inner._inn._iter._inner._to =
           ((long)(local_310._iter._inner._inner._inner._inn._iter._func.a)->_cursor -
           (long)(local_310._iter._inner._inner._inner._inn._iter._func.a)->_stack) / 0x30;
      local_310._iter._inner._inner._inner._inn._iter._inner._next = 0;
      local_310._iter._inner._inner._inner._inn._iter._inner._from = 0;
      local_310._iter._inner._inner._inner._next.
      super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>.
      super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>.
      _elem = (OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>)
              (OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*>
               )0x0;
      local_490._iter._inner._func.i = local_490._iter._func.i;
      local_310._iter._inner._inner._func.i = local_310._iter._inner._func.i;
      local_310._iter._inner._inner._inner._func.x = local_490._iter._inner._inner._func.x;
      TVar8 = const::{lambda(auto:1,auto:2)#1}::operator()(&sum,&local_490,&local_310);
      rhs._content = (uint64_t)Kernel::NumTraits<Kernel::RationalConstantType>::zeroT();
      pLVar10 = Kernel::NumTraits<Kernel::RationalConstantType>::eq(false,TVar8,rhs);
      Lib::Stack<Kernel::Literal_*>::push(&common,pLVar10);
      VVar2 = *(Value *)__begin4._iter.
                        super_OptionBase<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_&>.
                        super_OptionBaseRef<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_*>.
                        _elem;
      __begin4._cur.super_OptionBase<unsigned_int>._isSome =
           VVar2.init <
           *(uint *)((long)__begin4._iter.
                           super_OptionBase<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_&>.
                           super_OptionBaseRef<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_*>
                           ._elem + 8);
      if (__begin4._cur.super_OptionBase<unsigned_int>._isSome) {
        *(uint *)__begin4._iter.
                 super_OptionBase<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_&>.
                 super_OptionBaseRef<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_*>._elem =
             VVar2.init + 1;
        __begin4._cur.super_OptionBase<unsigned_int>._elem._elem = VVar2;
      }
    }
    MVar3._elem = *(Value *)__begin3._iter.
                            super_OptionBase<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_&>.
                            super_OptionBaseRef<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_*>
                            ._elem;
    bVar22 = (uint)MVar3._elem <
             ((Value *)
             ((long)__begin3._iter.
                    super_OptionBase<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_&>.
                    super_OptionBaseRef<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_*>._elem
             + 8))->init;
    if ((bool)bVar22) {
      *(uint *)__begin3._iter.super_OptionBase<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_&>
               .super_OptionBaseRef<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_*>._elem =
           (int)MVar3._elem + 1;
      __begin3._cur.super_OptionBase<unsigned_int>._elem._elem = MVar3._elem;
    }
    __begin3._cur.super_OptionBase<unsigned_int>._isSome = (bool)bVar22;
  }
  Lib::
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  ::Stack(&local_280,
          (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
           *)(in_RCX + 0x14));
  partitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>>>
            (&local_250,(ALASCA *)&local_280,orig);
  Lib::
  iterTraits<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>>>>
            ((IterTraits<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>_>
              *)&__begin3,(Lib *)&local_250,i_00);
  Lib::Stack<Kernel::Literal_*>::Stack(&local_1f8.common,&common);
  Lib::
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  ::Stack(&local_1f8.I,
          (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
           *)(in_RCX + 4));
  Lib::
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  ::Stack(&local_1f8.J,
          (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
           *)(in_RCX + 0xc));
  Lib::
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  ::Stack(&local_1f8.L,
          (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
           *)(in_RCX + 0x1c));
  local_1f8.b.x._id = b.x._id;
  local_1f8.b.x._ptr = b.x._ptr;
  local_1f8.withoutX.x._id = uVar1;
  local_1f8.withoutX.x._ptr = pMVar4;
  local_1f8.premise = (Clause *)found;
  local_1f8.Ksize = uVar13;
  Lib::
  IterTraits<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>>>>
  ::
  map<Inferences::ALASCA::VariableElimination::applyRule<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::Clause*,Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>>)const::_lambda(auto:1&)_3_>
            ((IterTraits<Lib::MappingIterator<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:313:12),_Kernel::Clause_*>_>
              *)&local_140,&__begin3,&local_1f8);
  Lib::
  pvi<Lib::IterTraits<Lib::MappingIterator<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>>>,Inferences::ALASCA::VariableElimination::applyRule<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::Clause*,Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>>)const::_lambda(auto:1&)_3_,Kernel::Clause*>>>
            ((Lib *)this,
             (IterTraits<Lib::MappingIterator<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:313:12),_Kernel::Clause_*>_>
              *)&local_140);
  Lib::
  MappingIterator<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/VariableElimination.cpp:313:12),_Kernel::Clause_*>
  ::~MappingIterator(&local_140);
  const::{lambda(auto:1&)#3}::~FoundVariable((_lambda_auto_1___3_ *)&local_1f8);
  PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  ::~PartitionIter((PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                    *)&__begin3);
  PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  ::~PartitionIter(&local_250);
  Lib::
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  ::~Stack(&local_280);
  Lib::Stack<Kernel::Literal_*>::~Stack(&common);
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this;
}

Assistant:

ClauseIterator VariableElimination::applyRule(Clause* premise, FoundVariable<NumTraits> found) const
{
  TIME_TRACE("alasca vampire elimination")
  using Numeral = typename NumTraits::ConstantType;
  auto x = found.var;
  DEBUG("eliminating var: ", x)
  auto& I = found.posIneq;
  auto& J = found.negIneq;
  auto& L = found.neq;
  auto& K = found.eq;
  auto Ksize = K.size();

  if (Ksize > 0) {
    env.statistics->alascaVarElimKNonZeroCnt++;
  }
  env.statistics->alascaVarElimKSum += Ksize;
  if (Ksize > env.statistics->alascaVarElimKMax)
    env.statistics->alascaVarElimKMax = Ksize;

  auto Csize = premise->size() - Ksize - I.size() - J.size() - L.size();

  auto withoutX = [x](auto foundVarInLiteral) 
    { return foundVarInLiteral.literal.term().iterSummands()
                              .filter([&](auto monom) { return monom.factors != x; }); };


  Stack<Literal*> common(Csize + I.size() * J.size() + I.size() * L.size() + J.size() * L.size());

  { /* adding C */

    Stack<unsigned> nonCInd;
    auto addNonCInd = [&](auto& x) { for (auto idxd : x) { nonCInd.push(idxd.idx); } };
    addNonCInd(found.eq);
    addNonCInd(found.neq);
    addNonCInd(found.posIneq);
    addNonCInd(found.negIneq);
    std::sort(nonCInd.begin(), nonCInd.end());

    auto iter = nonCInd.iterFifo();
    auto skip = iter.hasNext() ? iter.next() : premise->size();
    for (unsigned i = 0; i < premise->size(); i++) {
      if (skip == i) {
        skip = iter.hasNext() ? iter.next() : premise->size();
      } else {
        ASS(skip > i)
        common.push((*premise)[i]);
      }
    }
  }

  auto b = [x](auto& i) {
    return iterTraits(i.literal.term().iterSummands())
      .filter([&](auto monom) { return monom.factors != x; })
      .map([&](auto t) { return (t / i.numeral.abs()); })
      .map([&](auto t) { return (i.literal.symbol() == AlascaPredicate::EQ || i.literal.symbol() == AlascaPredicate::NEQ) && i.numeral.isNegative()
                                ? -t : t; });
  };

  auto sum = [](auto l, auto r) {
    return NumTraits::sum(
      l.map([](auto monom){ return monom.denormalize(); }),
      r.map([](auto monom){ return monom.denormalize(); })); };

  auto minus = [](auto i) { return i.map([](auto monom) { return Numeral(-1) * monom; }); };

  { 
    // adding { bi + bj >ij 0 | i ∈ I, j ∈ J } 
    for (auto& i : I) {
      for (auto& j : J) {
        auto gr = i.literal.symbol() == AlascaPredicate::GREATER && j.literal.symbol() == AlascaPredicate::GREATER 
          ?  NumTraits::greater
          : NumTraits::geq;
        ASS(i.numeral.isPositive())
        ASS(j.numeral.isNegative())

        common.push(gr(true, sum(b(i), b(j)), NumTraits::zero()));
      }
    }
  }

  {
    // adding {  bi - bl  >i 0 |  i ∈ I,  l ∈ L }
    for (auto& i : I) {
      for (auto& l : L) {
        auto gr = i.literal.symbol() == AlascaPredicate::GREATER ? NumTraits::greater
                                                              : NumTraits::geq;
        common.push(gr(true, sum(b(i), minus(b(l))), NumTraits::zero()));
      }
    }
  }

  {
    // adding {  bj + bl  >j 0 |  j ∈ J,  l ∈ L }
    for (auto& j : J) {
      for (auto& l : L) {
        auto gr = j.literal.symbol() == AlascaPredicate::GREATER ? NumTraits::greater
                                                              : NumTraits::geq;
        common.push(gr(true, sum(b(j), b(l)), NumTraits::zero()));
      }
    }
  }

  { // adding { bl1 - bl2 /= 0 | ordered pairs (l1, l2) of L }
    // TODO write a test for me
    for (auto i1 : iterTraits(getRangeIterator(0u, (unsigned)L.size()))) {
      for (auto i2 : iterTraits(getRangeIterator(i1 + 1, (unsigned)L.size()))) {
        auto& l1 = L[i1];
        auto& l2 = L[i2];
        common.push(NumTraits::eq(false, sum(b(l1), minus(b(l2))), NumTraits::zero()));
      }
    }
  }


  return pvi(iterTraits(partitionIter(std::move(K)))
      .map([common = std::move(common), 
            I = std::move(I), 
            J = std::move(J), 
            L = std::move(L), 
            withoutX, 
            premise, 
            Ksize,
            sum, minus, b](auto& par) {

        auto Kp = [&]() { return par.partition(0);};
        auto Km = [&]() { return par.partition(1); };

        auto Kpsize = par.partitionSize(0);
        auto Kmsize = Ksize - Kpsize;

        Stack<Literal*> concl(common.size() + I.size() * Kpsize + + J.size() * Kmsize);
        concl.loadFromIterator(common.iterFifo());

        // adding {  bi - bk  >= 0 |   i ∈ I,   k ∈ Km }
        for (auto& k : Km()) {
          for (auto& i : I) {
            concl.push(NumTraits::geq(true, sum(b(i), minus(b(k))), NumTraits::zero()));
          }
        }

        // adding {  bj + bk  >= 0 |   j ∈ J,   k ∈ Kp }
        for (auto& k : Kp()) {
          for (auto& j : J) {
            concl.push(NumTraits::geq(true, sum(b(j), b(k)), NumTraits::zero()));
          }
        }

        // adding { bk1 - bk2 >= 0 |  k1 ∈ Kp, k2 ∈ Km }
        for (auto& k1 : Kp()) {
          for (auto& k2 : Km()) {
            // TODO test me
            concl.push(NumTraits::geq(true, sum(b(k1), minus(b(k2))), NumTraits::zero()));
          }
        }

        // adding {  bk - bl  >= 0 |  k ∈ Kp, l ∈ L }
        for (auto& k : Kp()) {
          for (auto& l : L) {
            // TODO test me
            concl.push(NumTraits::geq(true, sum(b(k), minus(b(l))), NumTraits::zero()));
          }
        }

        // adding {  bl - bk  >= 0 |  k ∈ Km, l ∈ L }
        for (auto& k : Km()) {
          for (auto& l : L) {
            // TODO test me
            concl.push(NumTraits::geq(true, sum(b(l), minus(b(k))), NumTraits::zero()));
          }
        }

        Inference inf(GeneratingInference1(Kernel::InferenceRule::ALASCA_VARIABLE_ELIMINATION, premise));
        auto out = Clause::fromStack(concl, inf);
        return out;
      }));
}